

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::GeneratorResponseContext::GeneratorResponseContext
          (GeneratorResponseContext *this,Version *compiler_version,CodeGeneratorResponse *response,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  (this->super_GeneratorContext)._vptr_GeneratorContext =
       (_func_int **)&PTR__GeneratorResponseContext_00523460;
  Version::Version(&this->compiler_version_,(Arena *)0x0,compiler_version);
  this->response_ = response;
  this->parsed_files_ = parsed_files;
  return;
}

Assistant:

GeneratorResponseContext(
      const Version& compiler_version, CodeGeneratorResponse* response,
      const std::vector<const FileDescriptor*>& parsed_files)
      : compiler_version_(compiler_version),
        response_(response),
        parsed_files_(parsed_files) {}